

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O1

void OPNWriteMode(FM_OPN *OPN,int r,int v)

{
  INT32 *pIVar1;
  UINT8 UVar2;
  FM_CH *pFVar3;
  void *pvVar4;
  FM_IRQHANDLER p_Var5;
  FM_TIMERHANDLER p_Var6;
  FM_SLOT *SLOT;
  byte bVar7;
  byte bVar8;
  UINT32 UVar9;
  UINT8 UVar10;
  byte bVar11;
  int iVar12;
  
  bVar8 = (byte)v;
  switch(r) {
  case 0x22:
    if ((v & 8U) == 0) {
      OPN->lfo_timer_overflow = 0;
      OPN->LFO_AM = 0x7e;
      OPN->lfo_timer = 0;
      OPN->lfo_cnt = '\0';
      OPN->LFO_PM = 0;
    }
    else {
      OPN->lfo_timer_overflow = lfo_samples_per_step[v & 7] << 0x18;
    }
    break;
  case 0x24:
    (OPN->ST).TA = ((OPN->ST).TA & 3U) + v * 4;
    break;
  case 0x25:
    (OPN->ST).TA = v & 3U | (OPN->ST).TA & 0x3fcU;
    break;
  case 0x26:
    (OPN->ST).TB = bVar8;
    break;
  case 0x27:
    pvVar4 = (OPN->ST).param;
    if ((((OPN->ST).mode ^ v) & 0xc0) != 0) {
      pFVar3 = OPN->P_CH;
      pFVar3[2].SLOT[0].Incr = -1;
      if (((v & 0xc0U) != 0x80) && ((OPN->SL3).key_csm != '\0')) {
        if ((pFVar3[2].SLOT[0].key == '\0') && (1 < pFVar3[2].SLOT[0].state)) {
          pFVar3[2].SLOT[0].state = '\x01';
          bVar8 = pFVar3[2].SLOT[0].ssg;
          if ((bVar8 & 8) != 0) {
            if ((bVar8 & 4) != pFVar3[2].SLOT[0].ssgn) {
              pFVar3[2].SLOT[0].volume = 0x200 - pFVar3[2].SLOT[0].volume;
            }
            if (0x1ff < pFVar3[2].SLOT[0].volume) {
              pFVar3[2].SLOT[0].volume = 0x3ff;
              pFVar3[2].SLOT[0].state = '\0';
            }
            pFVar3[2].SLOT[0].vol_out = pFVar3[2].SLOT[0].tl + pFVar3[2].SLOT[0].volume;
          }
        }
        if ((pFVar3[2].SLOT[2].key == '\0') && (1 < pFVar3[2].SLOT[2].state)) {
          pFVar3[2].SLOT[2].state = '\x01';
          bVar8 = pFVar3[2].SLOT[2].ssg;
          if ((bVar8 & 8) != 0) {
            if ((bVar8 & 4) != pFVar3[2].SLOT[2].ssgn) {
              pFVar3[2].SLOT[2].volume = 0x200 - pFVar3[2].SLOT[2].volume;
            }
            if (0x1ff < pFVar3[2].SLOT[2].volume) {
              pFVar3[2].SLOT[2].volume = 0x3ff;
              pFVar3[2].SLOT[2].state = '\0';
            }
            pFVar3[2].SLOT[2].vol_out = pFVar3[2].SLOT[2].tl + pFVar3[2].SLOT[2].volume;
          }
        }
        if ((pFVar3[2].SLOT[1].key == '\0') && (1 < pFVar3[2].SLOT[1].state)) {
          pFVar3[2].SLOT[1].state = '\x01';
          bVar8 = pFVar3[2].SLOT[1].ssg;
          if ((bVar8 & 8) != 0) {
            if ((bVar8 & 4) != pFVar3[2].SLOT[1].ssgn) {
              pFVar3[2].SLOT[1].volume = 0x200 - pFVar3[2].SLOT[1].volume;
            }
            if (0x1ff < pFVar3[2].SLOT[1].volume) {
              pFVar3[2].SLOT[1].volume = 0x3ff;
              pFVar3[2].SLOT[1].state = '\0';
            }
            pFVar3[2].SLOT[1].vol_out = pFVar3[2].SLOT[1].tl + pFVar3[2].SLOT[1].volume;
          }
        }
        if ((pFVar3[2].SLOT[3].key == '\0') && (1 < pFVar3[2].SLOT[3].state)) {
          pFVar3[2].SLOT[3].state = '\x01';
          bVar8 = pFVar3[2].SLOT[3].ssg;
          if ((bVar8 & 8) != 0) {
            if ((bVar8 & 4) != pFVar3[2].SLOT[3].ssgn) {
              pFVar3[2].SLOT[3].volume = 0x200 - pFVar3[2].SLOT[3].volume;
            }
            if (0x1ff < pFVar3[2].SLOT[3].volume) {
              pFVar3[2].SLOT[3].volume = 0x3ff;
              pFVar3[2].SLOT[3].state = '\0';
            }
            pFVar3[2].SLOT[3].vol_out = pFVar3[2].SLOT[3].tl + pFVar3[2].SLOT[3].volume;
          }
        }
        (OPN->SL3).key_csm = '\0';
      }
    }
    if ((v & 0x20U) != 0) {
      bVar8 = (OPN->ST).status & 0xfd;
      (OPN->ST).status = bVar8;
      if (((OPN->ST).irq != '\0') && (((OPN->ST).irqmask & bVar8) == 0)) {
        (OPN->ST).irq = '\0';
        p_Var5 = (OPN->ST).IRQ_Handler;
        if (p_Var5 != (FM_IRQHANDLER)0x0) {
          (*p_Var5)(pvVar4,0);
        }
      }
    }
    if ((v & 0x10U) != 0) {
      bVar8 = (OPN->ST).status & 0xfe;
      (OPN->ST).status = bVar8;
      if (((OPN->ST).irq != '\0') && (((OPN->ST).irqmask & bVar8) == 0)) {
        (OPN->ST).irq = '\0';
        p_Var5 = (OPN->ST).IRQ_Handler;
        if (p_Var5 != (FM_IRQHANDLER)0x0) {
          (*p_Var5)((OPN->ST).param,0);
        }
      }
    }
    if (((v & 2U) != 0) && (((OPN->ST).mode & 2) == 0)) {
      iVar12 = (uint)(OPN->ST).TB * -0x10 + 0x1000;
      (OPN->ST).TBC = iVar12;
      p_Var6 = (OPN->ST).timer_handler;
      if (p_Var6 != (FM_TIMERHANDLER)0x0) {
        (*p_Var6)(pvVar4,1,iVar12 * (OPN->ST).timer_prescaler,(OPN->ST).clock);
      }
    }
    if (((v & 1U) != 0) && (((OPN->ST).mode & 1) == 0)) {
      iVar12 = 0x400 - (OPN->ST).TA;
      (OPN->ST).TAC = iVar12;
      p_Var6 = (OPN->ST).timer_handler;
      if (p_Var6 != (FM_TIMERHANDLER)0x0) {
        (*p_Var6)(pvVar4,0,iVar12 * (OPN->ST).timer_prescaler,(OPN->ST).clock);
      }
      pIVar1 = &(OPN->ST).TAC;
      *pIVar1 = *pIVar1 << 0xc;
    }
    (OPN->ST).mode = v;
    break;
  case 0x28:
    if ((v & 3U) == 3) {
      return;
    }
    bVar7 = bVar8 & 3;
    if (((v & 4U) != 0) && ((OPN->type & 4) != 0)) {
      bVar7 = (char)(v & 3U) + 3;
    }
    pFVar3 = OPN->P_CH;
    UVar2 = pFVar3[bVar7].SLOT[0].key;
    if ((v & 0x10U) == 0) {
      if (((UVar2 != '\0') && ((OPN->SL3).key_csm == '\0' || bVar7 == 3)) &&
         (1 < pFVar3[bVar7].SLOT[0].state)) {
        pFVar3[bVar7].SLOT[0].state = '\x01';
        bVar11 = pFVar3[bVar7].SLOT[0].ssg;
        if ((bVar11 & 8) != 0) {
          if ((bVar11 & 4) != pFVar3[bVar7].SLOT[0].ssgn) {
            pFVar3[bVar7].SLOT[0].volume = 0x200 - pFVar3[bVar7].SLOT[0].volume;
          }
          if (0x1ff < pFVar3[bVar7].SLOT[0].volume) {
            pFVar3[bVar7].SLOT[0].volume = 0x3ff;
            pFVar3[bVar7].SLOT[0].state = '\0';
          }
          UVar9 = pFVar3[bVar7].SLOT[0].tl + pFVar3[bVar7].SLOT[0].volume;
          UVar10 = '\0';
          goto LAB_00172917;
        }
      }
      UVar10 = '\0';
    }
    else {
      UVar10 = '\x01';
      if ((UVar2 == '\0') && ((OPN->SL3).key_csm == '\0' || bVar7 == 3)) {
        pFVar3[bVar7].SLOT[0].phase = 0;
        pFVar3[bVar7].SLOT[0].ssgn = '\0';
        if ((uint)pFVar3[bVar7].SLOT[0].ksr + pFVar3[bVar7].SLOT[0].ar < 0x5e) {
          bVar11 = 4;
          if (pFVar3[bVar7].SLOT[0].volume < 1) goto LAB_001728ae;
        }
        else {
          pFVar3[bVar7].SLOT[0].volume = 0;
LAB_001728ae:
          bVar11 = pFVar3[bVar7].SLOT[0].sl == 0 ^ 3;
        }
        pFVar3[bVar7].SLOT[0].state = bVar11;
        iVar12 = pFVar3[bVar7].SLOT[0].volume;
        if ((~pFVar3[bVar7].SLOT[0].ssg & 0xc) == 0) {
          UVar9 = (0x200U - iVar12 & 0x3ff) + pFVar3[bVar7].SLOT[0].tl;
          UVar10 = '\x01';
        }
        else {
          UVar9 = iVar12 + pFVar3[bVar7].SLOT[0].tl;
          UVar10 = '\x01';
        }
LAB_00172917:
        pFVar3[bVar7].SLOT[0].vol_out = UVar9;
      }
    }
    pFVar3[bVar7].SLOT[0].key = UVar10;
    UVar2 = pFVar3[bVar7].SLOT[2].key;
    if ((v & 0x20U) == 0) {
      if (((UVar2 != '\0') && ((OPN->SL3).key_csm == '\0' || bVar7 == 3)) &&
         (1 < pFVar3[bVar7].SLOT[2].state)) {
        pFVar3[bVar7].SLOT[2].state = '\x01';
        bVar11 = pFVar3[bVar7].SLOT[2].ssg;
        if ((bVar11 & 8) != 0) {
          if ((bVar11 & 4) != pFVar3[bVar7].SLOT[2].ssgn) {
            pFVar3[bVar7].SLOT[2].volume = 0x200 - pFVar3[bVar7].SLOT[2].volume;
          }
          if (0x1ff < pFVar3[bVar7].SLOT[2].volume) {
            pFVar3[bVar7].SLOT[2].volume = 0x3ff;
            pFVar3[bVar7].SLOT[2].state = '\0';
          }
          UVar9 = pFVar3[bVar7].SLOT[2].tl + pFVar3[bVar7].SLOT[2].volume;
          UVar10 = '\0';
          goto LAB_00172a5f;
        }
      }
      UVar10 = '\0';
    }
    else {
      UVar10 = '\x01';
      if ((UVar2 == '\0') && ((OPN->SL3).key_csm == '\0' || bVar7 == 3)) {
        pFVar3[bVar7].SLOT[2].phase = 0;
        pFVar3[bVar7].SLOT[2].ssgn = '\0';
        if ((uint)pFVar3[bVar7].SLOT[2].ksr + pFVar3[bVar7].SLOT[2].ar < 0x5e) {
          bVar11 = 4;
          if (pFVar3[bVar7].SLOT[2].volume < 1) goto LAB_001729cc;
        }
        else {
          pFVar3[bVar7].SLOT[2].volume = 0;
LAB_001729cc:
          bVar11 = pFVar3[bVar7].SLOT[2].sl == 0 ^ 3;
        }
        pFVar3[bVar7].SLOT[2].state = bVar11;
        iVar12 = pFVar3[bVar7].SLOT[2].volume;
        if ((~pFVar3[bVar7].SLOT[2].ssg & 0xc) == 0) {
          UVar9 = (0x200U - iVar12 & 0x3ff) + pFVar3[bVar7].SLOT[2].tl;
          UVar10 = '\x01';
        }
        else {
          UVar9 = iVar12 + pFVar3[bVar7].SLOT[2].tl;
          UVar10 = '\x01';
        }
LAB_00172a5f:
        pFVar3[bVar7].SLOT[2].vol_out = UVar9;
      }
    }
    pFVar3[bVar7].SLOT[2].key = UVar10;
    UVar2 = pFVar3[bVar7].SLOT[1].key;
    if ((v & 0x40U) == 0) {
      if (((UVar2 != '\0') && ((OPN->SL3).key_csm == '\0' || bVar7 == 3)) &&
         (1 < pFVar3[bVar7].SLOT[1].state)) {
        pFVar3[bVar7].SLOT[1].state = '\x01';
        bVar11 = pFVar3[bVar7].SLOT[1].ssg;
        if ((bVar11 & 8) != 0) {
          if ((bVar11 & 4) != pFVar3[bVar7].SLOT[1].ssgn) {
            pFVar3[bVar7].SLOT[1].volume = 0x200 - pFVar3[bVar7].SLOT[1].volume;
          }
          if (0x1ff < pFVar3[bVar7].SLOT[1].volume) {
            pFVar3[bVar7].SLOT[1].volume = 0x3ff;
            pFVar3[bVar7].SLOT[1].state = '\0';
          }
          UVar9 = pFVar3[bVar7].SLOT[1].tl + pFVar3[bVar7].SLOT[1].volume;
          UVar10 = '\0';
          goto LAB_00172b98;
        }
      }
      UVar10 = '\0';
    }
    else {
      UVar10 = '\x01';
      if ((UVar2 == '\0') && ((OPN->SL3).key_csm == '\0' || bVar7 == 3)) {
        pFVar3[bVar7].SLOT[1].phase = 0;
        pFVar3[bVar7].SLOT[1].ssgn = '\0';
        if ((uint)pFVar3[bVar7].SLOT[1].ksr + pFVar3[bVar7].SLOT[1].ar < 0x5e) {
          bVar11 = 4;
          if (pFVar3[bVar7].SLOT[1].volume < 1) goto LAB_00172b0b;
        }
        else {
          pFVar3[bVar7].SLOT[1].volume = 0;
LAB_00172b0b:
          bVar11 = pFVar3[bVar7].SLOT[1].sl == 0 ^ 3;
        }
        pFVar3[bVar7].SLOT[1].state = bVar11;
        iVar12 = pFVar3[bVar7].SLOT[1].volume;
        if ((~pFVar3[bVar7].SLOT[1].ssg & 0xc) == 0) {
          UVar9 = (0x200U - iVar12 & 0x3ff) + pFVar3[bVar7].SLOT[1].tl;
          UVar10 = '\x01';
        }
        else {
          UVar9 = iVar12 + pFVar3[bVar7].SLOT[1].tl;
          UVar10 = '\x01';
        }
LAB_00172b98:
        pFVar3[bVar7].SLOT[1].vol_out = UVar9;
      }
    }
    pFVar3[bVar7].SLOT[1].key = UVar10;
    UVar2 = pFVar3[bVar7].SLOT[3].key;
    if (-1 < (char)bVar8) {
      if (((UVar2 != '\0') && ((OPN->SL3).key_csm == '\0' || bVar7 == 3)) &&
         (1 < pFVar3[bVar7].SLOT[3].state)) {
        pFVar3[bVar7].SLOT[3].state = '\x01';
        bVar8 = pFVar3[bVar7].SLOT[3].ssg;
        if ((bVar8 & 8) != 0) {
          if ((bVar8 & 4) != pFVar3[bVar7].SLOT[3].ssgn) {
            pFVar3[bVar7].SLOT[3].volume = 0x200 - pFVar3[bVar7].SLOT[3].volume;
          }
          if (0x1ff < pFVar3[bVar7].SLOT[3].volume) {
            pFVar3[bVar7].SLOT[3].volume = 0x3ff;
            pFVar3[bVar7].SLOT[3].state = '\0';
          }
          pFVar3[bVar7].SLOT[3].vol_out = pFVar3[bVar7].SLOT[3].tl + pFVar3[bVar7].SLOT[3].volume;
        }
      }
      pFVar3[bVar7].SLOT[3].key = '\0';
      return;
    }
    if ((UVar2 == '\0') && ((OPN->SL3).key_csm == '\0' || bVar7 == 3)) {
      pFVar3[bVar7].SLOT[3].phase = 0;
      pFVar3[bVar7].SLOT[3].ssgn = '\0';
      if ((uint)pFVar3[bVar7].SLOT[3].ksr + pFVar3[bVar7].SLOT[3].ar < 0x5e) {
        bVar8 = 4;
        if (pFVar3[bVar7].SLOT[3].volume < 1) goto LAB_00172c9b;
      }
      else {
        pFVar3[bVar7].SLOT[3].volume = 0;
LAB_00172c9b:
        bVar8 = pFVar3[bVar7].SLOT[3].sl == 0 ^ 3;
      }
      pFVar3[bVar7].SLOT[3].state = bVar8;
      iVar12 = pFVar3[bVar7].SLOT[3].volume;
      if ((~pFVar3[bVar7].SLOT[3].ssg & 0xc) == 0) {
        UVar9 = (0x200U - iVar12 & 0x3ff) + pFVar3[bVar7].SLOT[3].tl;
      }
      else {
        UVar9 = iVar12 + pFVar3[bVar7].SLOT[3].tl;
      }
      pFVar3[bVar7].SLOT[3].vol_out = UVar9;
    }
    pFVar3[bVar7].SLOT[3].key = '\x01';
  }
  return;
}

Assistant:

static void OPNWriteMode(FM_OPN *OPN, int r, int v)
{
	UINT8 c;
	FM_CH *CH;

	switch(r)
	{
	case 0x21:	/* Test */
		break;
	case 0x22:	/* LFO FREQ (YM2608/YM2610/YM2610B/YM2612) */
		if (v&8) /* LFO enabled ? */
		{
			#if 0
			if (!OPN->lfo_timer_overflow)
			{
				/* restart LFO */
				OPN->lfo_cnt   = 0;
				OPN->lfo_timer = 0;
				OPN->LFO_AM    = 0;
				OPN->LFO_PM    = 0;
			}
			#endif

			OPN->lfo_timer_overflow = lfo_samples_per_step[v&7] << LFO_SH;
		}
		else
		{
			/* Valley Bell: Ported from Genesis Plus GX 1.71
				hold LFO waveform in reset state */
			OPN->lfo_timer_overflow = 0;
			OPN->lfo_timer = 0;
			OPN->lfo_cnt = 0;


			OPN->LFO_PM = 0;
			OPN->LFO_AM = 126;
			/* OPN->lfo_timer_overflow = 0; */
		}
		break;
	case 0x24:	/* timer A High 8*/
		OPN->ST.TA = (OPN->ST.TA & 0x03)|(((int)v)<<2);
		break;
	case 0x25:	/* timer A Low 2*/
		OPN->ST.TA = (OPN->ST.TA & 0x3fc)|(v&3);
		break;
	case 0x26:	/* timer B */
		OPN->ST.TB = (UINT8)v;
		break;
	case 0x27:	/* mode, timer control */
		set_timers( OPN, &(OPN->ST),OPN->ST.param,v );
		break;
	case 0x28:	/* key on / off */
		c = v & 0x03;
		if( c == 3 ) break;
		if( (v&0x04) && (OPN->type & TYPE_6CH) ) c+=3;
		CH = OPN->P_CH;
		CH = &CH[c];
		if(v&0x10) FM_KEYON(OPN,CH,SLOT1); else FM_KEYOFF(OPN,CH,SLOT1);
		if(v&0x20) FM_KEYON(OPN,CH,SLOT2); else FM_KEYOFF(OPN,CH,SLOT2);
		if(v&0x40) FM_KEYON(OPN,CH,SLOT3); else FM_KEYOFF(OPN,CH,SLOT3);
		if(v&0x80) FM_KEYON(OPN,CH,SLOT4); else FM_KEYOFF(OPN,CH,SLOT4);
		break;
	}
}